

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boost_unordered.hpp
# Opt level: O2

locator * __thiscall
boost::unordered::detail::foa::
table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::RandSeqProductionSymbol_const*,unsigned_int>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::RandSeqProductionSymbol_const*,void>,std::equal_to<slang::ast::RandSeqProductionSymbol_const*>,slang::detail::hashing::StackAllocator<std::pair<slang::ast::RandSeqProductionSymbol_const*const,unsigned_int>,128ul,16ul>>
::
nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::ast::RandSeqProductionSymbol_const*,int>
          (locator *__return_storage_ptr__,
          table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::RandSeqProductionSymbol_const*,unsigned_int>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::RandSeqProductionSymbol_const*,void>,std::equal_to<slang::ast::RandSeqProductionSymbol_const*>,slang::detail::hashing::StackAllocator<std::pair<slang::ast::RandSeqProductionSymbol_const*const,unsigned_int>,128ul,16ul>>
          *this,arrays_type *arrays_,size_t pos0,size_t hash,try_emplace_args_t *args,
          RandSeqProductionSymbol **args_1,int *args_2)

{
  group_type_pointer pgVar1;
  group_type_pointer pgVar2;
  group_type_pointer pgVar3;
  value_type_pointer ppVar4;
  uint uVar5;
  ushort uVar6;
  byte bVar7;
  ulong uVar8;
  long lVar9;
  undefined1 auVar10 [16];
  
  uVar8 = arrays_->groups_size_mask;
  pgVar3 = arrays_->groups_;
  lVar9 = 1;
  while( true ) {
    pgVar1 = pgVar3 + pos0;
    pgVar2 = pgVar3 + pos0;
    bVar7 = pgVar2->m[0xf].n;
    auVar10[0] = -(pgVar2->m[0].n == '\0');
    auVar10[1] = -(pgVar2->m[1].n == '\0');
    auVar10[2] = -(pgVar2->m[2].n == '\0');
    auVar10[3] = -(pgVar2->m[3].n == '\0');
    auVar10[4] = -(pgVar2->m[4].n == '\0');
    auVar10[5] = -(pgVar2->m[5].n == '\0');
    auVar10[6] = -(pgVar2->m[6].n == '\0');
    auVar10[7] = -(pgVar2->m[7].n == '\0');
    auVar10[8] = -(pgVar2->m[8].n == '\0');
    auVar10[9] = -(pgVar2->m[9].n == '\0');
    auVar10[10] = -(pgVar2->m[10].n == '\0');
    auVar10[0xb] = -(pgVar2->m[0xb].n == '\0');
    auVar10[0xc] = -(pgVar2->m[0xc].n == '\0');
    auVar10[0xd] = -(pgVar2->m[0xd].n == '\0');
    auVar10[0xe] = -(pgVar2->m[0xe].n == '\0');
    auVar10[0xf] = -(bVar7 == 0);
    uVar6 = (ushort)(SUB161(auVar10 >> 7,0) & 1) | (ushort)(SUB161(auVar10 >> 0xf,0) & 1) << 1 |
            (ushort)(SUB161(auVar10 >> 0x17,0) & 1) << 2 |
            (ushort)(SUB161(auVar10 >> 0x1f,0) & 1) << 3 |
            (ushort)(SUB161(auVar10 >> 0x27,0) & 1) << 4 |
            (ushort)(SUB161(auVar10 >> 0x2f,0) & 1) << 5 |
            (ushort)(SUB161(auVar10 >> 0x37,0) & 1) << 6 |
            (ushort)(SUB161(auVar10 >> 0x3f,0) & 1) << 7 |
            (ushort)(SUB161(auVar10 >> 0x47,0) & 1) << 8 |
            (ushort)(SUB161(auVar10 >> 0x4f,0) & 1) << 9 |
            (ushort)(SUB161(auVar10 >> 0x57,0) & 1) << 10 |
            (ushort)(SUB161(auVar10 >> 0x5f,0) & 1) << 0xb |
            (ushort)(SUB161(auVar10 >> 0x67,0) & 1) << 0xc |
            (ushort)(SUB161(auVar10 >> 0x6f,0) & 1) << 0xd |
            (ushort)(SUB161(auVar10 >> 0x77,0) & 1) << 0xe;
    if (uVar6 != 0) break;
    pgVar1->m[0xf].n = bVar7 | '\x01' << ((byte)hash & 7);
    pos0 = pos0 + lVar9 & uVar8;
    lVar9 = lVar9 + 1;
  }
  ppVar4 = arrays_->elements_;
  uVar5 = 0;
  if (uVar6 != 0) {
    for (; (uVar6 >> uVar5 & 1) == 0; uVar5 = uVar5 + 1) {
    }
  }
  uVar8 = (ulong)(uVar5 << 4);
  *(RandSeqProductionSymbol **)((long)&ppVar4[pos0 * 0xf].first + uVar8) = *args_1;
  *(int *)((long)&ppVar4[pos0 * 0xf].second + uVar8) = *args_2;
  pgVar1->m[uVar5].n =
       *(uchar *)(&group15<boost::unordered::detail::foa::plain_integral>::match_word(unsigned_long)
                   ::word + ((uint)hash & 0xff));
  __return_storage_ptr__->pg = pgVar1;
  __return_storage_ptr__->n = uVar5;
  __return_storage_ptr__->p =
       (pair<const_slang::ast::RandSeqProductionSymbol_*const,_unsigned_int> *)
       ((long)&ppVar4[pos0 * 0xf].first + uVar8);
  return __return_storage_ptr__;
}

Assistant:

locator nosize_unchecked_emplace_at(const arrays_type& arrays_, std::size_t pos0,
                                        std::size_t hash, Args&&... args) {
        for (prober pb(pos0);; pb.next(arrays_.groups_size_mask)) {
            auto pos = pb.get();
            auto pg = arrays_.groups() + pos;
            auto mask = pg->match_available();
            if (BOOST_LIKELY(mask != 0)) {
                auto n = unchecked_countr_zero(mask);
                auto p = arrays_.elements() + pos * N + n;
                construct_element(p, std::forward<Args>(args)...);
                pg->set(n, hash);
                BOOST_UNORDERED_ADD_STATS(cstats.insertion, (pb.length()));
                return {pg, n, p};
            }
            else
                pg->mark_overflow(hash);
        }
    }